

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cpp
# Opt level: O2

void __thiscall dpfb::Font::readKerningPairs(Font *this)

{
  ushort uVar1;
  pointer pRVar2;
  KerningSource KVar3;
  char32_t cVar4;
  char32_t cVar5;
  ulong uVar6;
  vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> rawKerningPairs;
  KerningParams kerningParams;
  _Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> local_48;
  
  kerningParams.pxSize = (this->bakingOptions).fontPxSize;
  kerningParams.pxPerEm = (int)(this->head).unitsPerEm;
  rawKerningPairs.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rawKerningPairs.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rawKerningPairs.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  KVar3 = (this->bakingOptions).kerningSource;
  if ((KVar3 & ~kern) == gpos) {
    readKerningPairsGpos
              ((vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *)&local_48,
               &(this->fontStream).super_Stream,&this->sfntOffsetTable,&kerningParams);
    std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::_M_move_assign
              (&rawKerningPairs,&local_48);
    std::_Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::~_Vector_base
              (&local_48);
    KVar3 = (this->bakingOptions).kerningSource;
  }
  if ((KVar3 == kern) ||
     ((KVar3 == kernAndGpos &&
      (rawKerningPairs.
       super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
       super__Vector_impl_data._M_start ==
       rawKerningPairs.
       super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
       super__Vector_impl_data._M_finish)))) {
    readKerningPairsKern
              ((vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *)&local_48,
               &(this->fontStream).super_Stream,&this->sfntOffsetTable,&kerningParams);
    std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::_M_move_assign
              (&rawKerningPairs,&local_48);
    std::_Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::~_Vector_base
              (&local_48);
  }
  if (rawKerningPairs.
      super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
      super__Vector_impl_data._M_start !=
      rawKerningPairs.
      super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    sortGlyphs(this,glyphIdx);
    uVar6 = 0;
    while (uVar6 < (ulong)((long)rawKerningPairs.
                                 super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)rawKerningPairs.
                                 super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      if (rawKerningPairs.
          super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6].amount == 0) {
        __assert_fail("rawKerningPair.amount != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/font.cpp"
                      ,0x27a,"void dpfb::Font::readKerningPairs()");
      }
      uVar1 = rawKerningPairs.
              super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar6].glyphIdx1;
      cVar4 = glyphIdxToCp(this,(uint)uVar1);
      while( true ) {
        pRVar2 = rawKerningPairs.
                 super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (((ulong)((long)rawKerningPairs.
                           super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)rawKerningPairs.
                           super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar6) ||
           (rawKerningPairs.
            super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6].glyphIdx1 != uVar1)) break;
        if (rawKerningPairs.
            super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6].amount == 0) {
          __assert_fail("rawKerningPair.amount != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/font.cpp"
                        ,0x28b,"void dpfb::Font::readKerningPairs()");
        }
        if (cVar4 != L'\0') {
          cVar5 = glyphIdxToCp(this,(uint)rawKerningPairs.
                                          super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar6].glyphIdx2
                              );
          if (cVar5 != L'\0') {
            local_48._M_impl.super__Vector_impl_data._M_finish._0_4_ = pRVar2[uVar6].amount;
            local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = cVar4;
            local_48._M_impl.super__Vector_impl_data._M_start._4_4_ = cVar5;
            std::vector<dpfb::KerningPair,_std::allocator<dpfb::KerningPair>_>::
            emplace_back<dpfb::KerningPair>(&this->kerningPairs,(KerningPair *)&local_48);
          }
        }
        uVar6 = uVar6 + 1;
      }
    }
  }
  std::_Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::~_Vector_base
            (&rawKerningPairs.
              super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>);
  return;
}

Assistant:

void Font::readKerningPairs()
{
    const KerningParams kerningParams {
        bakingOptions.fontPxSize,
        head.unitsPerEm
    };

    std::vector<RawKerningPair> rawKerningPairs;
    if (bakingOptions.kerningSource == KerningSource::gpos
            || bakingOptions.kerningSource == KerningSource::kernAndGpos)
        rawKerningPairs = readKerningPairsGpos(
            fontStream, sfntOffsetTable, kerningParams);

    // According to the OpenType manual, the "kern" table should be
    // applied when there is no GPOS table, or if the GPOS table doesn't
    // contain any "kern" features for the resolved language.
    // https://docs.microsoft.com/en-us/typography/opentype/spec/recom
    if (bakingOptions.kerningSource == KerningSource::kern
            || (bakingOptions.kerningSource == KerningSource::kernAndGpos
                && rawKerningPairs.empty()))
        rawKerningPairs = readKerningPairsKern(
            fontStream, sfntOffsetTable, kerningParams);
    if (rawKerningPairs.empty())
        return;

    // Prepare for binary search
    sortGlyphs(GlyphsOrder::glyphIdx);

    std::size_t i = 0;
    while (i < rawKerningPairs.size()) {
        const auto& rawKerningPair = rawKerningPairs[i];

        assert(rawKerningPair.amount != 0);

        const auto glyphIdx1 = rawKerningPair.glyphIdx1;
        const auto cp1 = glyphIdxToCp(glyphIdx1);

        // The raw pairs are grouped by the first glyph index (but
        // not necessarily fully sorted in case of GPOS as we read
        // pairs for multiple languages), so we can avoid calling
        // glyphIdxToCp() every time for the first code point in a
        // sequence.
        while (i < rawKerningPairs.size()) {
            const auto& rawKerningPair = rawKerningPairs[i];
            if (rawKerningPair.glyphIdx1 != glyphIdx1)
                break;

            ++i;

            assert(rawKerningPair.amount != 0);

            if (cp1 == 0)
                continue;

            const auto cp2 = glyphIdxToCp(rawKerningPair.glyphIdx2);
            if (cp2 == 0)
                continue;

            kerningPairs.push_back({cp1, cp2, rawKerningPair.amount});
        }
    }
}